

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O2

int __thiscall
baryonyx::itm::
solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  rc_data *prVar1;
  long lVar2;
  longdouble lVar3;
  longdouble lVar4;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  lVar2 = 0;
  for (; begin != end; begin = begin + 1) {
    sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
    lVar3 = (longdouble)0;
    lVar4 = lVar3;
    for (; (tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
           (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
           local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
        local_38._M_head_impl = local_38._M_head_impl + 2) {
      lVar3 = (this->pi)._M_t.
              super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
              super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
              super__Head_base<0UL,_long_double_*,_false>._M_head_impl[local_38._M_head_impl[1]] +
              lVar3;
      lVar4 = (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
              ._M_t.super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
              super__Head_base<0UL,_long_double_*,_false>._M_head_impl[*local_38._M_head_impl] +
              lVar4;
    }
    prVar1 = (this->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    prVar1[lVar2].id = (int)lVar2;
    prVar1[lVar2].value =
         ((this->c->linear_elements)._M_t.
          super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
          super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
          super__Head_base<0UL,_long_double_*,_false>._M_head_impl[begin->column] - lVar3) - lVar4;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2;
}

Assistant:

int compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                              sparse_matrix<int>::row_iterator end,
                              const Xtype& x) noexcept
    {
        int r_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                sum_a_pi += pi[std::get<0>(ht)->row];
                sum_a_p += P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;

            ++r_size;
        }

        return r_size;
    }